

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfDeque.c
# Opt level: O3

void * sbfDeque_popBack(sbfDeque dq)

{
  int *piVar1;
  undefined8 *puVar2;
  sbfDequeItemImpl *psVar3;
  sbfDequeItemImpl **ppsVar4;
  long lVar5;
  long lVar6;
  anon_struct_16_2_4dd83919_for_mListEntry *paVar7;
  void *pvVar8;
  bool bVar9;
  
  puVar2 = (undefined8 *)(dq->mList).tqh_last[1]->mPointer;
  if (puVar2 == (undefined8 *)0x0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = (void *)*puVar2;
    psVar3 = (sbfDequeItemImpl *)puVar2[1];
    ppsVar4 = (sbfDequeItemImpl **)puVar2[2];
    paVar7 = &psVar3->mListEntry;
    if (psVar3 == (sbfDequeItemImpl *)0x0) {
      paVar7 = (anon_struct_16_2_4dd83919_for_mListEntry *)&dq->mList;
    }
    paVar7->tqe_prev = ppsVar4;
    *ppsVar4 = psVar3;
    lVar5 = puVar2[-2];
    LOCK();
    piVar1 = (int *)(*(long *)(lVar5 + 0x28) + 0x1c);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    do {
      lVar6 = *(long *)(lVar5 + 0x20);
      puVar2[-1] = lVar6;
      LOCK();
      bVar9 = lVar6 == *(long *)(lVar5 + 0x20);
      if (bVar9) {
        *(long *)(lVar5 + 0x20) = (long)(puVar2 + -2);
      }
      UNLOCK();
    } while (!bVar9);
  }
  return pvVar8;
}

Assistant:

void*
sbfDeque_popBack (sbfDeque dq)
{
    sbfDequeItem dqe;
    void*        vp;

    dqe = TAILQ_LAST (&dq->mList, sbfDequeItemListImpl);
    if (dqe == NULL)
        return NULL;
    vp = dqe->mPointer;

    TAILQ_REMOVE (&dq->mList, dqe, mListEntry);
    sbfPool_put (dqe);

    return vp;
}